

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcoreapplication.cpp
# Opt level: O0

QStringList * QCoreApplication::arguments(void)

{
  int iVar1;
  long lVar2;
  QCoreApplicationPrivate *this;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  int a;
  char **argv;
  int argc;
  QCoreApplicationPrivate *d;
  QStringList *list;
  rvalue_ref in_stack_ffffffffffffff68;
  QStringList *data;
  undefined4 in_stack_ffffffffffffff80;
  int iVar3;
  QByteArrayView in_stack_ffffffffffffffc8;
  qsizetype in_stack_ffffffffffffffd8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  data = in_RDI;
  QList<QString>::QList((QList<QString> *)0x1a7cf8);
  if (self != (QCoreApplication *)0x0) {
    this = d_func((QCoreApplication *)0x1a7d49);
    iVar1 = *this->argc;
    QList<QString>::reserve((QList<QString> *)this,in_stack_ffffffffffffffd8);
    for (iVar3 = 0; iVar3 < iVar1; iVar3 = iVar3 + 1) {
      QByteArrayView::QByteArrayView<char_*,_true>
                ((QByteArrayView *)CONCAT44(iVar3,in_stack_ffffffffffffff80),(char **)data);
      QString::fromLocal8Bit(in_stack_ffffffffffffffc8);
      QList<QString>::operator<<(in_RDI,in_stack_ffffffffffffff68);
      QString::~QString((QString *)0x1a7dd4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return data;
}

Assistant:

QStringList QCoreApplication::arguments()
{
    QStringList list;

    if (!self) {
        qWarning("QCoreApplication::arguments: Please instantiate the QApplication object first");
        return list;
    }

    const QCoreApplicationPrivate *d = self->d_func();

    const int argc = d->argc;
    char ** const argv = d->argv;
    list.reserve(argc);

#if defined(Q_OS_WIN)
    const bool argsModifiedByUser = d->origArgv == nullptr;
    if (!argsModifiedByUser) {
        QStringList commandLineArguments = winCmdArgs();

        // Even if the user didn't modify argv before passing them
        // on to QCoreApplication, derived QApplications might have.
        // If that's the case argc will differ from origArgc.
        if (argc != d->origArgc) {
            // Note: On MingGW the arguments from GetCommandLine are
            // not wildcard expanded (if wildcard expansion is enabled),
            // as opposed to the arguments in argv. This means we can't
            // compare commandLineArguments to argv/origArgc, but
            // must remove elements by value, based on whether they
            // were filtered out from argc.
            for (int i = 0; i < d->origArgc; ++i) {
                if (!contains(argc, argv, d->origArgv[i]))
                    commandLineArguments.removeAll(QString::fromLocal8Bit(d->origArgv[i]));
            }
        }

        return commandLineArguments;
    } // Fall back to rebuilding from argv/argc when a modified argv was passed.
#endif // defined(Q_OS_WIN)

    for (int a = 0; a < argc; ++a)
        list << QString::fromLocal8Bit(argv[a]);

    return list;
}